

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::LeaveMulticastGroup(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  int iVar1;
  in6_addr mcastIP;
  ipv6_mreq mreq;
  anon_union_16_3_a3f0114d_for___in6_u local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  uint local_18;
  
  iVar1 = -0x72;
  if (this->init == true) {
    iVar1 = -0x71;
    if ((this->created == true) && (iVar1 = -0x6c, addr->addresstype == IPv6Address)) {
      local_38._0_8_ = *(undefined8 *)&addr->field_0xc;
      local_38._8_8_ = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4);
      iVar1 = -0x70;
      if (((char)local_38._0_8_ == -1) &&
         (iVar1 = RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
                  DeleteElement(&this->multicastgroups,(in6_addr *)&local_38), -1 < iVar1)) {
        local_28 = local_38._0_8_;
        uStack_20 = local_38._8_8_;
        local_18 = this->mcastifidx;
        setsockopt(this->rtpsock,0x29,0x15,&local_28,0x14);
        local_28 = local_38._0_8_;
        uStack_20 = local_38._8_8_;
        local_18 = this->mcastifidx;
        setsockopt(this->rtcpsock,0x29,0x15,&local_28,0x14);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::LeaveMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;
	in6_addr mcastIP = address.GetIP();
	
	if (!RTPUDPV6TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.DeleteElement(mcastIP);
	if (status >= 0)
	{	
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_LEAVE_GROUP,mcastIP,status);
		status = 0;
	}
	
	MAINMUTEX_UNLOCK
	return status;
}